

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

void __thiscall
Jupiter::IRC::Client::addNamesToChannel(Client *this,Channel *in_channel,string_view in_names)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  pointer __s;
  _func_int **pp_Var3;
  undefined8 uVar4;
  void *pvVar5;
  ulong uVar6;
  string_view in_name;
  string_view in_nickname;
  shared_ptr<Jupiter::IRC::Client::User> user;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  names;
  undefined1 local_80 [24];
  _Alloc_hider local_68;
  ulong *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  jessilib::
  split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_char>
            ((container_type *)&local_58,in_names._M_str,in_names._M_str + in_names._M_len,' ');
  local_60 = (ulong *)local_58._8_8_;
  uVar4 = local_58._M_allocated_capacity;
  if (local_58._M_allocated_capacity != local_58._8_8_) {
    do {
      uVar1 = *(ulong *)uVar4;
      if (uVar1 != 0) {
        uVar2 = *(ulong *)(uVar4 + 8);
        __n = (this->m_prefixes)._M_string_length;
        if (__n == 0) {
          uVar6 = 0;
        }
        else {
          __s = (this->m_prefixes)._M_dataplus._M_p;
          uVar6 = 0;
          do {
            pvVar5 = memchr(__s,(int)*(char *)(uVar2 + uVar6),__n);
            if (pvVar5 == (void *)0x0) goto LAB_001328be;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
          uVar6 = 0xffffffffffffffff;
        }
LAB_001328be:
        if (uVar6 != 0xffffffffffffffff) {
          in_name._M_str = (char *)(uVar1 - uVar6);
          if (uVar1 < uVar6) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar6,uVar1);
          }
          in_name._M_len = (size_t)this;
          findUserOrAdd((Client *)local_80,in_name);
          local_80._16_8_ = local_80._0_8_;
          local_68._M_p = (pointer)local_80._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_80._8_8_ + 8) = *(int *)(local_80._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_80._8_8_ + 8) = *(int *)(local_80._8_8_ + 8) + 1;
            }
          }
          Channel::addUser((Channel *)&stack0xffffffffffffffc0,
                           (shared_ptr<Jupiter::IRC::Client::User> *)in_channel);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          pp_Var3 = (_func_int **)local_80._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_p);
            pp_Var3 = (_func_int **)local_80._0_8_;
          }
          while (uVar6 != 0) {
            in_nickname._M_str = (char *)pp_Var3[1];
            in_nickname._M_len = (size_t)pp_Var3[2];
            Channel::addUserPrefix(in_channel,in_nickname,*(char *)(uVar2 + (uVar6 - 1)));
            uVar6 = uVar6 - 1;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
          }
        }
      }
      uVar4 = uVar4 + 0x10;
    } while ((ulong *)uVar4 != local_60);
  }
  if ((ulong *)local_58._M_allocated_capacity != (ulong *)0x0) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48 - local_58._0_8_);
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::addNamesToChannel(Channel &in_channel, std::string_view in_names) {
	size_t offset;
	std::vector<std::string_view> names = jessilib::split_view(in_names, ' ');
	for (auto name : names) {
		if (name.empty()) {
			// Good candidate for a warning log
			continue;
		}

		offset = name.find_first_not_of(m_prefixes);
		if (offset == std::string_view::npos) {
			// The user's name is nothing but prefixes!? Good candidate for an error log
			continue;
		}

		// Add the user
		auto user = Client::findUserOrAdd(name.substr(offset));
		in_channel.addUser(user);

		// Add any prefixes we received to the user
		while (offset > 0) {
			--offset;
			in_channel.addUserPrefix(user->getNickname(), name[offset]);
		}
	}
}